

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O0

void bill_dummy_object(obj *otmp)

{
  uint uVar1;
  monst *shkp;
  obj *obj;
  obj *dummy;
  obj *otmp_local;
  
  if ((*(uint *)&otmp->field_0x4a >> 2 & 1) != 0) {
    shkp = shop_keeper(level,u.ushops[0]);
    subfrombill(otmp,shkp);
  }
  obj = (obj *)malloc((ulong)((int)otmp->oxlth + (uint)otmp->onamelth) + 0x68);
  memcpy(obj,otmp,0x68);
  obj->where = '\0';
  uVar1 = flags.ident + 1;
  obj->o_id = flags.ident;
  flags.ident = uVar1;
  if (obj->o_id == 0) {
    uVar1 = flags.ident + 1;
    obj->o_id = flags.ident;
    flags.ident = uVar1;
  }
  obj->timed = '\0';
  if (otmp->oxlth != 0) {
    memcpy(obj->oextra,otmp->oextra,(long)otmp->oxlth);
  }
  if (otmp->onamelth != '\0') {
    strncpy((char *)((long)obj->oextra + (long)(int)obj->oxlth),
            (char *)((long)otmp->oextra + (long)(int)otmp->oxlth),(long)(int)(uint)otmp->onamelth);
  }
  if ((obj->otyp == 0xe5) || (obj->otyp == 0xe6)) {
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfff7ffff;
  }
  addtobill(obj,'\0','\x01','\x01');
  *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xfffffff7 | 8;
  *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xfffffffb;
  return;
}

Assistant:

void bill_dummy_object(struct obj *otmp)
{
	struct obj *dummy;

	if (otmp->unpaid)
	    subfrombill(otmp, shop_keeper(level, *u.ushops));
	dummy = newobj(otmp->oxlth + otmp->onamelth);
	*dummy = *otmp;
	dummy->where = OBJ_FREE;
	dummy->o_id = flags.ident++;
	if (!dummy->o_id) dummy->o_id = flags.ident++;	/* ident overflowed */
	dummy->timed = 0;
	if (otmp->oxlth)
	    memcpy(dummy->oextra,
			otmp->oextra, otmp->oxlth);
	if (otmp->onamelth)
	    strncpy(ONAME(dummy), ONAME(otmp), (int)otmp->onamelth);
	if (Is_candle(dummy)) dummy->lamplit = 0;
	addtobill(dummy, FALSE, TRUE, TRUE);
	otmp->no_charge = 1;
	otmp->unpaid = 0;
	return;
}